

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::ReadChannelInfo
               (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  int *piVar5;
  int *piVar6;
  char *p;
  bool bVar7;
  ChannelInfo info;
  value_type local_90;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  piVar6 = (int *)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
  local_58 = channels;
  if ((int *)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish == piVar6) {
    uVar3 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
      operator_delete(local_90.name._M_dataplus._M_p);
    }
    _Unwind_Resume(uVar3);
  }
  do {
    local_90.name._M_dataplus._M_p = (pointer)&local_90.name.field_2;
    iVar2 = *piVar6;
    if ((uchar)iVar2 == '\0') break;
    local_90.name._M_string_length = 0;
    local_90.name.field_2._M_local_buf[0] = '\0';
    piVar1 = (int *)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
    if ((long)piVar1 - (long)piVar6 < 0) {
      bVar7 = false;
    }
    else {
      bVar7 = piVar1 != piVar6;
      if (piVar1 == piVar6) {
LAB_001d4688:
        local_90.name._M_string_length = 0;
        local_90.name.field_2._M_local_buf[0] = '\0';
        piVar6 = (int *)0x0;
      }
      else {
        piVar5 = piVar6;
        if ((uchar)*piVar6 != '\0') {
          uVar4 = 1;
          do {
            bVar7 = uVar4 < (ulong)((long)piVar1 - (long)piVar6);
            if (!bVar7) goto LAB_001d4688;
            piVar5 = (int *)((long)piVar5 + 1);
            uVar4 = uVar4 + 1;
          } while (*(uchar *)piVar5 != '\0');
        }
        if (!bVar7) goto LAB_001d4688;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,piVar6,piVar5);
        std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        piVar6 = (int *)((long)piVar5 + 1);
      }
      if ((piVar6 == (int *)0x0) && (local_90.name._M_string_length == 0)) {
        piVar6 = (int *)0x0;
        bVar7 = false;
      }
      else {
        bVar7 = piVar6 + 4 <
                (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish;
        if (bVar7) {
          local_90.pixel_type = *piVar6;
          local_90.p_linear = (uchar)piVar6[1];
          local_90.x_sampling = piVar6[2];
          local_90.y_sampling = piVar6[3];
          bVar7 = true;
          std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::push_back
                    (local_58,&local_90);
          piVar6 = piVar6 + 4;
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
      operator_delete(local_90.name._M_dataplus._M_p);
    }
  } while (bVar7);
  return (uchar)iVar2 == '\0';
}

Assistant:

static bool ReadChannelInfo(std::vector<ChannelInfo> &channels,
                            const std::vector<unsigned char> &data) {
  const char *p = reinterpret_cast<const char *>(&data.at(0));

  for (;;) {
    if ((*p) == 0) {
      break;
    }
    ChannelInfo info;

    tinyexr_int64 data_len = static_cast<tinyexr_int64>(data.size()) -
                             (p - reinterpret_cast<const char *>(data.data()));
    if (data_len < 0) {
      return false;
    }

    p = ReadString(&info.name, p, size_t(data_len));
    if ((p == NULL) && (info.name.empty())) {
      // Buffer overrun. Issue #51.
      return false;
    }

    const unsigned char *data_end =
        reinterpret_cast<const unsigned char *>(p) + 16;
    if (data_end >= (data.data() + data.size())) {
      return false;
    }

    memcpy(&info.pixel_type, p, sizeof(int));
    p += 4;
    info.p_linear = static_cast<unsigned char>(p[0]);  // uchar
    p += 1 + 3;                                        // reserved: uchar[3]
    memcpy(&info.x_sampling, p, sizeof(int));          // int
    p += 4;
    memcpy(&info.y_sampling, p, sizeof(int));  // int
    p += 4;

    tinyexr::swap4(&info.pixel_type);
    tinyexr::swap4(&info.x_sampling);
    tinyexr::swap4(&info.y_sampling);

    channels.push_back(info);
  }

  return true;
}